

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlAssignDist1(Ssw_Sml_t *p,uint *pPat)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pAVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  if (p->nFrames < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x273,"void Ssw_SmlAssignDist1(Ssw_Sml_t *, unsigned int *)");
  }
  pAVar5 = p->pAig;
  if (p->nFrames == 1) {
    pVVar4 = pAVar5->vCis;
    if (0 < pVVar4->nSize) {
      uVar10 = 0;
      do {
        Ssw_SmlObjAssignConst
                  (p,(Aig_Obj_t *)pVVar4->pArray[uVar10],
                   (uint)((pPat[uVar10 >> 5 & 0x7ffffff] >> ((uint)uVar10 & 0x1f) & 1) != 0),0);
        uVar10 = uVar10 + 1;
        pAVar5 = p->pAig;
        pVVar4 = pAVar5->vCis;
      } while ((long)uVar10 < (long)pVVar4->nSize);
    }
    uVar6 = p->nWordsTotal * 0x20 - 1;
    if (pAVar5->nObjs[2] < (int)uVar6) {
      uVar6 = pAVar5->nObjs[2];
    }
    if (0 < (int)uVar6) {
      uVar10 = 1;
      do {
        if ((long)pVVar4->nSize <= (long)(uVar10 - 1)) {
LAB_006a8e86:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar2 = (uint *)((long)&p[1].pAig +
                         (uVar10 >> 5 & 0x7ffffff) * 4 +
                         (long)p->nWordsTotal *
                         (long)*(int *)((long)pVVar4->pArray[uVar10 - 1] + 0x24) * 4);
        *puVar2 = *puVar2 ^ 1 << ((byte)uVar10 & 0x1f);
        bVar12 = uVar10 != uVar6;
        uVar10 = uVar10 + 1;
      } while (bVar12);
    }
  }
  else {
    iVar3 = pAVar5->nObjs[2] - pAVar5->nRegs;
    if (0 < p->nFrames) {
      iVar9 = 0;
      lVar11 = 0;
      do {
        pAVar5 = p->pAig;
        if (0 < pAVar5->nTruePis) {
          lVar8 = 0;
          do {
            if (pAVar5->vCis->nSize <= lVar8) goto LAB_006a8e86;
            uVar6 = iVar9 + (int)lVar8;
            Ssw_SmlObjAssignConst
                      (p,(Aig_Obj_t *)pAVar5->vCis->pArray[lVar8],
                       (uint)((pPat[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0),(int)lVar11);
            lVar8 = lVar8 + 1;
            pAVar5 = p->pAig;
          } while (lVar8 < pAVar5->nTruePis);
        }
        lVar11 = lVar11 + 1;
        iVar9 = iVar9 + iVar3;
      } while (lVar11 < p->nFrames);
    }
    pAVar5 = p->pAig;
    if (0 < pAVar5->nRegs) {
      iVar9 = 0;
      do {
        uVar6 = pAVar5->nTruePis + iVar9;
        if (((int)uVar6 < 0) || (pAVar5->vCis->nSize <= (int)uVar6)) goto LAB_006a8e86;
        iVar1 = iVar9 + 1;
        uVar7 = p->nFrames * iVar3 + iVar9;
        Ssw_SmlObjAssignConst
                  (p,(Aig_Obj_t *)pAVar5->vCis->pArray[uVar6],
                   (uint)((pPat[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0),0);
        pAVar5 = p->pAig;
        iVar9 = iVar1;
      } while (iVar1 < pAVar5->nRegs);
    }
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Saig_ManForEachPi( p->pAig, pObj, i )
                Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info
        k = 0;
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pFrames == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pFrames) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}